

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<duckdb::vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_40;
  CreateInfo *local_38;
  
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      local_40._M_head_impl = (CreateInfo *)0x0;
      iVar1 = (*this->_vptr_Deserializer[10])(this);
      if ((char)iVar1 != '\0') {
        (*this->_vptr_Deserializer[6])(this);
        CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffc8,this);
        local_40._M_head_impl = local_38;
        (*this->_vptr_Deserializer[7])(this);
      }
      (*this->_vptr_Deserializer[0xb])(this);
      ::std::
      vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
                ((vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 &local_40);
      if (local_40._M_head_impl != (CreateInfo *)0x0) {
        (*((local_40._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}